

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::~RpcServerResponseImpl
          (RpcServerResponseImpl *this)

{
  RpcServerResponseImpl *this_local;
  
  kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~HashMap
            (&this->resolutionsAtReturnTime);
  BuilderCapabilityTable::~BuilderCapabilityTable(&this->capTable);
  kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::~Own(&this->message);
  return;
}

Assistant:

RpcServerResponseImpl(RpcConnectionState& connectionState,
                          kj::Own<OutgoingRpcMessage>&& message,
                          rpc::Payload::Builder payload)
        : connectionState(connectionState),
          message(kj::mv(message)),
          payload(payload) {}